

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O3

bool duckdb::AlpAnalyze<float>(AnalyzeState *state,Vector *input,idx_t count)

{
  AnalyzeState *pAVar1;
  value_type vVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  size_type sVar5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  long lVar11;
  unsigned_long val;
  size_type sVar12;
  ulong uVar13;
  size_type sVar14;
  undefined4 uVar15;
  double dVar16;
  vector<float,_true> current_vector_values;
  vector<float,_true> current_vector_sample;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  allocator_type local_d9;
  uint local_d8;
  value_type_conflict5 local_d4;
  ulong local_d0;
  vector<float,_std::allocator<float>_> local_c8;
  vector<float,_std::allocator<float>_> local_b0;
  AnalyzeState *local_98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  UnifiedVectorFormat local_78;
  
  pp_Var3 = state[3]._vptr_AnalyzeState;
  if (0x2492492492492492 < (ulong)((long)pp_Var3 * 0x6db6db6db6db6db7)) {
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var3 + 1);
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
    return true;
  }
  pp_Var4 = state[2]._vptr_AnalyzeState;
  state[2].info.block_manager =
       (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
  state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var3 + 1);
  if ((count < 0x20) && (pp_Var4 != (_func_int **)0x0)) {
    return true;
  }
  local_98 = state;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  val = 0x400;
  if (count < 0x400) {
    val = count;
  }
  uVar6 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  uVar9 = (ulong)uVar6;
  dVar16 = ceil((double)uVar9 * 0.03125);
  local_d0 = 1;
  if (1 < (uint)(long)dVar16) {
    local_d0 = (long)dVar16 & 0xffffffff;
  }
  dVar16 = ceil((double)uVar9 / (double)local_d0);
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ = 0;
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_90,uVar9,(value_type_conflict6 *)&local_c8,(allocator_type *)&local_b0);
  local_b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  ::std::vector<float,_std::allocator<float>_>::vector
            (&local_c8,uVar9,(value_type_conflict5 *)&local_b0,(allocator_type *)&local_d4);
  local_d4 = 0.0;
  ::std::vector<float,_std::allocator<float>_>::vector
            (&local_b0,(long)dVar16 & 0xffffffff,&local_d4,&local_d9);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (uVar6 == 0) goto LAB_01039be2;
    sVar12 = 0;
    do {
      sVar14 = sVar12;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        sVar14 = (size_type)(local_78.sel)->sel_vector[sVar12];
      }
      vVar2 = *(value_type *)(local_78.data + sVar14 * 4);
      pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)&local_c8,sVar12);
      *pvVar8 = vVar2;
      sVar12 = sVar12 + 1;
    } while (uVar9 != sVar12);
  }
  else {
    if (uVar6 == 0) goto LAB_01039be2;
    sVar12 = 0;
    sVar5 = 0;
    local_d8 = uVar6;
    do {
      __n = sVar5;
      sVar14 = sVar12;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        sVar14 = (size_type)(local_78.sel)->sel_vector[sVar12];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [sVar14 >> 6] >> (sVar14 & 0x3f) & 1) == 0);
      }
      vVar2 = *(value_type *)(local_78.data + sVar14 * 4);
      pvVar7 = vector<unsigned_short,_true>::operator[]
                         ((vector<unsigned_short,_true> *)&local_90,__n);
      *pvVar7 = (value_type)sVar12;
      pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)&local_c8,sVar12);
      *pvVar8 = vVar2;
      sVar12 = sVar12 + 1;
      sVar5 = __n + uVar13;
    } while (uVar9 != sVar12);
    uVar6 = local_d8;
    if (__n + uVar13 != 0) {
      uVar15 = 0;
      if (local_d8 != 0) {
        uVar10 = 0;
        do {
          if (uVar10 != local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]) {
            uVar15 = *(undefined4 *)
                      (CONCAT62(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._2_6_,
                                local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_2_) + uVar10 * 4);
            break;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      lVar11 = 0;
      do {
        *(undefined4 *)
         (CONCAT62(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start._2_6_,
                   local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start._0_2_) +
         (ulong)local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start[lVar11] * 4) = uVar15;
        lVar11 = lVar11 + 1;
      } while (uVar13 + __n != lVar11);
    }
  }
  if (uVar6 != 0) {
    sVar14 = 0;
    uVar9 = (uVar9 - 1) / local_d0;
    sVar12 = 0;
    do {
      pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)&local_c8,sVar14);
      vVar2 = *pvVar8;
      pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)&local_b0,sVar12);
      *pvVar8 = vVar2;
      sVar12 = sVar12 + 1;
      sVar14 = sVar14 + local_d0;
    } while (uVar9 + 1 != sVar12);
  }
LAB_01039be2:
  pAVar1 = local_98;
  ::std::vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>>::
  emplace_back<duckdb::vector<float,true>>
            ((vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>> *)
             (local_98 + 5),(vector<float,_true> *)&local_c8);
  ::std::vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>>::
  emplace_back<duckdb::vector<float,true>>
            ((vector<duckdb::vector<float,true>,std::allocator<duckdb::vector<float,true>>> *)
             &pAVar1[3].info,(vector<float,_true> *)&local_b0);
  pAVar1 = pAVar1 + 2;
  pAVar1->_vptr_AnalyzeState = (_func_int **)((long)pAVar1->_vptr_AnalyzeState + 1);
  if ((void *)CONCAT44(local_b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_b0.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_b0.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT62(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._2_6_,
                       local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
    operator_delete((void *)CONCAT62(local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._2_6_,
                                     local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_2_));
  }
  if (local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool AlpAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;
	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_values(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the entire sampled vector
	//! We need to store the entire sampled vector to perform the 'analyze' compression in it
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			current_vector_values[i] = value;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(i);
			nulls_idx += is_null;
			current_vector_values[i] = value;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<T>(current_vector_values.data(),
		                                              current_vector_null_positions.data(),
		                                              sampling_params.n_lookup_values, nulls_idx);
	}

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
		current_vector_sample[sample_idx] = current_vector_values[i];
		sample_idx++;
	}
	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	//! A std::move is needed to avoid a copy of the pushed vector
	analyze_state.complete_vectors_sampled.push_back(std::move(current_vector_values));
	analyze_state.rowgroup_sample.push_back(std::move(current_vector_sample));
	analyze_state.vectors_sampled_count++;
	return true;
}